

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.hpp
# Opt level: O0

unsigned_long __thiscall
strq::Generator<unsigned_long,void>::operator()
          (Generator<unsigned_long,void> *this,
          Arithmetic<std::uniform_int_distribution<unsigned_long>_> schema)

{
  result_type_conflict2 rVar1;
  result_type_conflict rVar2;
  param_type local_2750 [2];
  random_device local_2730;
  undefined1 local_13a8 [8];
  mt19937 gen;
  Generator<unsigned_long,_void> *this_local;
  Arithmetic<std::uniform_int_distribution<unsigned_long>_> schema_local;
  
  schema_local._dist._M_param._M_a = schema._dist._M_param._M_b;
  this_local = schema._dist._M_param._M_a;
  gen._M_p = (size_t)this;
  std::random_device::random_device(&local_2730);
  rVar1 = std::random_device::operator()(&local_2730);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_13a8,(ulong)rVar1);
  std::random_device::~random_device(&local_2730);
  local_2750[0] =
       (param_type)
       Arithmetic<std::uniform_int_distribution<unsigned_long>_>::distribution
                 ((Arithmetic<std::uniform_int_distribution<unsigned_long>_> *)&this_local);
  rVar2 = std::uniform_int_distribution<unsigned_long>::operator()
                    ((uniform_int_distribution<unsigned_long> *)local_2750,
                     (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)local_13a8);
  return rVar2;
}

Assistant:

auto operator()(Arithmetic<Dist> schema) -> T
        {
            std::mt19937 gen{std::random_device{}()};

            if constexpr (std::is_same_v<T, int8_t> ||
                          std::is_same_v<T, uint8_t> ||
                          std::is_same_v<T, char> ||
                          std::is_same_v<T, unsigned char>) {

                return static_cast<T>(random<int>(schema));
            }
            else {
                if constexpr (std::is_same_v<Dist, detail::NoDistribution>) {
                    return std::uniform_int_distribution<T>{}(gen);
                } else {
                    return schema.distribution()(gen);
                }
            }
        }